

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O2

void __thiscall pbrt::OctahedralVector::OctahedralVector(OctahedralVector *this,Vector3f v)

{
  float fVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint16_t uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  auVar12._4_60_ = v._12_60_;
  auVar12._0_4_ = v.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar11._8_56_ = v._8_56_;
  auVar11._0_8_ = v.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar9._8_4_ = 0x7fffffff;
  auVar9._0_8_ = 0x7fffffff7fffffff;
  auVar9._12_4_ = 0x7fffffff;
  auVar13 = vmovshdup_avx(auVar11._0_16_);
  auVar10 = vandps_avx(auVar11._0_16_,auVar9);
  auVar9 = vandps_avx(auVar12._0_16_,auVar9);
  auVar10 = vhaddps_avx(auVar10,auVar10);
  fVar1 = auVar9._0_4_ + auVar10._0_4_;
  auVar10._0_4_ = auVar13._0_4_ / fVar1;
  auVar10._4_12_ = auVar13._4_12_;
  auVar14._0_4_ = v.super_Tuple3<pbrt::Vector3,_float>.x / fVar1;
  auVar14._4_12_ = auVar11._4_12_;
  auVar13._0_12_ = ZEXT812(0);
  auVar13._12_4_ = 0;
  if (0.0 <= auVar12._0_4_ / fVar1) {
    uVar8 = Encode(auVar14._0_4_);
    this->x = uVar8;
  }
  else {
    auVar4._8_4_ = 0x7fffffff;
    auVar4._0_8_ = 0x7fffffff7fffffff;
    auVar4._12_4_ = 0x7fffffff;
    auVar9 = vandps_avx512vl(auVar10,auVar4);
    uVar2 = vcmpss_avx512f(auVar14,auVar13,1);
    bVar3 = (bool)((byte)uVar2 & 1);
    fVar1 = 1.0 - auVar9._0_4_;
    auVar5._8_4_ = 0x80000000;
    auVar5._0_8_ = 0x8000000080000000;
    auVar5._12_4_ = 0x80000000;
    auVar9 = vxorps_avx512vl(ZEXT416((uint)fVar1),auVar5);
    uVar8 = Encode((Float)((uint)bVar3 * auVar9._0_4_ + (uint)!bVar3 * (int)fVar1));
    uVar2 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)auVar10._0_4_),0xe);
    bVar3 = (bool)((byte)uVar2 & 1);
    this->x = uVar8;
    auVar6._8_4_ = 0x7fffffff;
    auVar6._0_8_ = 0x7fffffff7fffffff;
    auVar6._12_4_ = 0x7fffffff;
    auVar10 = vandps_avx512vl(auVar14,auVar6);
    fVar1 = 1.0 - auVar10._0_4_;
    auVar7._8_4_ = 0x80000000;
    auVar7._0_8_ = 0x8000000080000000;
    auVar7._12_4_ = 0x80000000;
    auVar10 = vxorps_avx512vl(ZEXT416((uint)fVar1),auVar7);
    auVar10._0_4_ = (Float)((uint)bVar3 * auVar10._0_4_ + (uint)!bVar3 * (int)fVar1);
  }
  uVar8 = Encode(auVar10._0_4_);
  this->y = uVar8;
  return;
}

Assistant:

PBRT_CPU_GPU
    OctahedralVector(Vector3f v) {
        v /= std::abs(v.x) + std::abs(v.y) + std::abs(v.z);
        if (v.z >= 0) {
            x = Encode(v.x);
            y = Encode(v.y);
        } else {
            // Encode octahedral vector with $z < 0$
            x = Encode((1 - std::abs(v.y)) * SignNotZero(v.x));
            y = Encode((1 - std::abs(v.x)) * SignNotZero(v.y));
        }
    }